

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileDisposal.cpp
# Opt level: O1

void createNewFold(void)

{
  int iVar1;
  char *__command;
  ostream *poVar2;
  
  __command = catStrStr("mkdir ",answerAddress);
  iVar1 = system(__command);
  if (iVar1 == 0) {
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"can\'t create a new fold for answers");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

void createNewFold(){
    const char *mkdirCommand = catStrStr("mkdir ",answerAddress);
    int t= system(mkdirCommand);
    if (t != 0){
        cout << "can't create a new fold for answers" << endl;
        exit(-1);
    }

}